

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void get_payload(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                cio_read_buffer *buffer,size_t num_bytes)

{
  uint8_t *data;
  ulong uVar1;
  _Bool _Var2;
  
  _Var2 = handled_read_error((cio_websocket *)handler_context,err);
  if (!_Var2) {
    data = buffer->fetch_ptr;
    if ((*(byte *)((long)handler_context + 0x10) & 0x10) == 0) {
      num_bytes = (long)buffer->add_ptr - (long)data;
      uVar1 = *(ulong *)((long)handler_context + 8);
      if (uVar1 < num_bytes) {
        num_bytes = uVar1;
      }
      *(ulong *)((long)handler_context + 8) = uVar1 - num_bytes;
    }
    buffer->fetch_ptr = data + num_bytes;
    handle_frame((cio_websocket *)handler_context,data,num_bytes);
    return;
  }
  return;
}

Assistant:

static void get_payload(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)buffered_stream;

	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	if (cio_likely(!is_control_frame(websocket->ws_private.ws_flags.opcode))) {
		size_t data_in_buffer = cio_read_buffer_unread_bytes(buffer);
		num_bytes = CIO_MIN(websocket->ws_private.remaining_read_frame_length, data_in_buffer);
		websocket->ws_private.remaining_read_frame_length -= num_bytes;
	}

	cio_read_buffer_consume(buffer, num_bytes);
	handle_frame(websocket, ptr, num_bytes);
}